

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_unix.cpp
# Opt level: O2

void __thiscall QDnsLookupRunnable::query(QDnsLookupRunnable *this,QDnsLookupReply *reply)

{
  long lVar1;
  QVLAStorage<1UL,_1UL,_1232LL> *__s;
  uchar *puVar2;
  uchar uVar3;
  ushort uVar4;
  undefined2 uVar5;
  long lVar6;
  ReplyBuffer *pRVar7;
  QDnsCachedName *pQVar8;
  QSharedDataPointer<QDnsHostAddressRecordPrivate> QVar9;
  Data *pDVar10;
  QDnsDomainNameRecord QVar11;
  QDnsLookupReply *pQVar12;
  void *pvVar13;
  bool bVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  NetworkLayerProtocol NVar18;
  quint32 qVar19;
  uint uVar20;
  qsizetype qVar21;
  int *piVar22;
  ulong uVar23;
  long lVar24;
  QDnsHostAddressRecordPrivate *pQVar25;
  QDnsDomainNameRecordPrivate *pQVar26;
  QDnsServiceRecordPrivate *pQVar27;
  QDnsMailExchangeRecordPrivate *pQVar28;
  QDnsTextRecordPrivate *pQVar29;
  long lVar30;
  ushort uVar31;
  char *pcVar32;
  QHostAddress *this_00;
  anon_class_56_5_c3b57c2e *this_01;
  int iVar33;
  ulong uVar34;
  long offset;
  ushort uVar35;
  char16_t *pcVar36;
  long lVar37;
  QSharedDataPointer<QDnsDomainNameRecordPrivate> QVar38;
  QList<QDnsDomainNameRecord> *this_02;
  long in_FS_OFFSET;
  QSpan<unsigned_char,_18446744073709551615UL> query;
  QDnsDomainNameRecord record_1;
  QDnsTextRecord record_4;
  QDnsHostAddressRecord record;
  char16_t *pcStack_910;
  qsizetype local_908;
  QArrayDataPointer<char16_t> local_900;
  anon_class_56_5_c3b57c2e local_8e8;
  int status;
  uint local_8a4;
  QDnsLookupReply *reply_local;
  undefined1 local_898 [24];
  uchar *response;
  ReplyBuffer local_878;
  QueryBuffer qbuffer;
  remove_pointer_t<res_state> state;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  reply_local = reply;
  memcpy(&state,&DAT_00260178,0x238);
  iVar16 = __res_ninit(&state);
  if (iVar16 < 0) {
    piVar22 = __errno_location();
    iVar16 = *piVar22;
    qErrnoWarning(iVar16,"QDnsLookup: Resolver initialization failed");
    QDnsLookupReply::makeResolverSystemError(reply_local,iVar16);
    goto LAB_0021a376;
  }
  memset(&qbuffer,0xaa,0x120);
  pcVar32 = (this->requestName).d.ptr;
  if (pcVar32 == (char *)0x0) {
    pcVar32 = (char *)&QByteArray::_empty;
  }
  uVar17 = res_nmkquery(&state,0,pcVar32,1,this->requestType,0,0,0,&qbuffer,0x120);
  if ((int)uVar17 < 0) {
LAB_0021a2c9:
    QDnsLookupReply::makeResolverSystemError(reply_local,-1);
  }
  else {
    puVar2 = qbuffer._M_elems + uVar17;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = ')';
    puVar2[3] = '\x04';
    puVar2[4] = 0xd0;
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    puVar2 = qbuffer._M_elems + (ulong)uVar17 + 7;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    qbuffer._M_elems[10] = '\0';
    qbuffer._M_elems[0xb] = '\x01';
    uVar17 = uVar17 + 0xb;
    if ((int)uVar17 < 0) goto LAB_0021a2c9;
    pcVar36 = (char16_t *)(ulong)uVar17;
    __s = &local_878.super_QVLAStorage<1UL,_1UL,_1232LL>;
    memset(__s,0xaa,0x4d0);
    pQVar12 = reply_local;
    local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.a = 0x4d0;
    local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.s = 0x4d0;
    local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr = __s;
    if (this->protocol == DnsOverTls) {
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size._0_4_ = uVar17;
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data = qbuffer._M_elems;
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size._4_4_ = 0;
      bVar14 = sendDnsOverTls(this,reply_local,query,&local_878);
      if (!bVar14) goto LAB_0021a35c;
      uVar34 = local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.s & 0xffffffff;
LAB_00219855:
      pvVar13 = local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
      local_8a4 = (uint)uVar34;
      if (-1 < (int)local_8a4) {
        if (local_8a4 < 0xc) {
          local_8e8.cache.d.d = (Data *)0x0;
          local_8e8.cache.d.ptr = (QDnsCachedName *)0x0;
          local_8e8.cache.d.size = 0;
          QDnsLookupReply::makeInvalidReplyError(reply_local,(QString *)&local_8e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_8e8)
          ;
        }
        else if ((((char *)local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr)[3] & 0xfU
                 ) == 0) {
          local_8e8.response = &response;
          response = (uchar *)local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
          local_8e8.status = &status;
          status = -0x55555556;
          local_8e8.cache.d.size = 0;
          local_8e8.cache.d.d = (Data *)0x0;
          local_8e8.cache.d.ptr = (QDnsCachedName *)0x0;
          local_8e8.responseLength = (int *)&local_8a4;
          local_8e8.reply = &reply_local;
          uVar23 = *(ulong *)(char *)local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
          if ((uVar23 & 0xffff00000000) == 0x10000000000) {
            QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                      ((QString *)&local_900,&local_8e8,0xc);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_900);
            if (-1 < status) {
              lVar30 = (ulong)(uint)status + 0x10;
              uVar34 = (ulong)(int)local_8a4;
              uVar23 = *(ulong *)(char *)pvVar13;
              if ((long)uVar34 < lVar30) {
                uVar23 = uVar23 | 0xffff00000000;
                *(ulong *)(char *)pvVar13 = uVar23;
                lVar30 = 0xc;
              }
              goto LAB_002199b6;
            }
          }
          else {
            lVar30 = 0xc;
LAB_002199b6:
            uVar15 = (ushort)(uVar23 >> 0x20);
            if ((ushort)(uVar15 << 8 | uVar15 >> 8) < 2) {
              uVar15 = (ushort)(uVar23 >> 0x30);
              iVar16 = 0;
              while ((lVar30 < (int)uVar34 &&
                     (iVar16 < (int)(uint)(ushort)(uVar15 << 8 | uVar15 >> 8)))) {
                local_898._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_898._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_898._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                          ((QString *)local_898,&local_8e8,lVar30);
                pQVar12 = reply_local;
                lVar24 = (long)status;
                if (lVar24 < 0) goto LAB_0021a34d;
                offset = lVar24 + lVar30 + 10;
                if ((int)local_8a4 < offset) goto LAB_0021a34d;
                lVar37 = lVar30 + lVar24;
                uVar4 = *(ushort *)(response + lVar37 + 8);
                uVar35 = uVar4 << 8 | uVar4 >> 8;
                lVar1 = (ulong)uVar35 + offset;
                if ((int)local_8a4 < lVar1) goto LAB_0021a34d;
                if (*(short *)(response + lVar37 + 2) == 0x100) {
                  uVar31 = *(ushort *)(response + lVar37) << 8 | *(ushort *)(response + lVar37) >> 8
                  ;
                  uVar17 = *(uint *)(response + lVar37 + 4);
                  uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                           uVar17 << 0x18;
                  if (uVar31 == 0x34) {
                    if (uVar35 < 3) {
                      pcVar32 = "Invalid TLS association record";
                      goto LAB_0021a320;
                    }
                    uVar5 = *(undefined2 *)(response + lVar37 + 10);
                    uVar3 = response[lVar37 + 0xc];
                    record.d.d.ptr =
                         (QSharedDataPointer<QDnsHostAddressRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
                    QDnsTlsAssociationRecord::QDnsTlsAssociationRecord
                              ((QDnsTlsAssociationRecord *)&record);
                    QString::operator=((QString *)((long)record.d.d.ptr + 8),(QString *)local_898);
                    *(uint *)((long)record.d.d.ptr + 0x20) = uVar17;
                    *(undefined2 *)((long)record.d.d.ptr + 0x24) = uVar5;
                    *(uchar *)((long)record.d.d.ptr + 0x26) = uVar3;
                    QByteArray::assign<unsigned_char_*,_true>
                              ((QByteArray *)((long)record.d.d.ptr + 0x28),
                               response + lVar24 + lVar30 + 0xd,response + offset + (ulong)uVar35);
                    QList<QDnsTlsAssociationRecord>::emplaceBack<QDnsTlsAssociationRecord>
                              (&reply_local->tlsAssociationRecords,
                               (QDnsTlsAssociationRecord *)&record);
                    QDnsTlsAssociationRecord::~QDnsTlsAssociationRecord
                              ((QDnsTlsAssociationRecord *)&record);
                    goto LAB_0021a2ab;
                  }
                  if (uVar31 == 2) {
                    record_1.d.d.ptr =
                         (QSharedDataPointer<QDnsDomainNameRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
                    QDnsDomainNameRecord::QDnsDomainNameRecord(&record_1);
                    pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                        (&record_1.d);
                    QString::operator=(&(pQVar26->super_QDnsRecordPrivate).name,(QString *)local_898
                                      );
                    pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                        (&record_1.d);
                    (pQVar26->super_QDnsRecordPrivate).timeToLive = uVar17;
                    QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                              ((QString *)&record,&local_8e8,offset);
                    pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                        (&record_1.d);
                    QVar9.d.ptr = (totally_ordered_wrapper<QDnsHostAddressRecordPrivate_*>)
                                  (pQVar26->value).d.d;
                    pcVar36 = (pQVar26->value).d.ptr;
                    (pQVar26->value).d.d = (Data *)record.d.d.ptr;
                    (pQVar26->value).d.ptr = pcStack_910;
                    qVar21 = (pQVar26->value).d.size;
                    (pQVar26->value).d.size = local_908;
                    record.d.d.ptr =
                         (QSharedDataPointer<QDnsHostAddressRecordPrivate>)
                         (QSharedDataPointer<QDnsHostAddressRecordPrivate>)QVar9.d.ptr;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&record);
                    pcStack_910 = pcVar36;
                    local_908 = qVar21;
                    if (-1 < status) {
                      this_02 = &reply_local->nameServerRecords;
                      goto LAB_0021a17a;
                    }
                    pcVar32 = "Invalid name server record";
LAB_0021a24d:
                    pQVar12 = reply_local;
                    iVar33 = status;
                    QDnsLookup::tr((QString *)&record,pcVar32,(char *)0x0,-1);
                    QDnsLookupReply::makeInvalidReplyError(pQVar12,(QString *)&record);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&record);
LAB_0021a26a:
                    QDnsDomainNameRecord::~QDnsDomainNameRecord(&record_1);
LAB_0021a2a3:
                    if (iVar33 < 0) goto LAB_0021a34d;
                  }
                  else {
                    if (uVar31 == 5) {
                      record_1.d.d.ptr =
                           (QSharedDataPointer<QDnsDomainNameRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
                      QDnsDomainNameRecord::QDnsDomainNameRecord(&record_1);
                      pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                          (&record_1.d);
                      QString::operator=(&(pQVar26->super_QDnsRecordPrivate).name,
                                         (QString *)local_898);
                      pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                          (&record_1.d);
                      (pQVar26->super_QDnsRecordPrivate).timeToLive = uVar17;
                      QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                ((QString *)&record,&local_8e8,offset);
                      pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                          (&record_1.d);
                      QVar9.d.ptr = (totally_ordered_wrapper<QDnsHostAddressRecordPrivate_*>)
                                    (pQVar26->value).d.d;
                      pcVar36 = (pQVar26->value).d.ptr;
                      (pQVar26->value).d.d = (Data *)record.d.d.ptr;
                      (pQVar26->value).d.ptr = pcStack_910;
                      qVar21 = (pQVar26->value).d.size;
                      (pQVar26->value).d.size = local_908;
                      record.d.d.ptr =
                           (QSharedDataPointer<QDnsHostAddressRecordPrivate>)
                           (QSharedDataPointer<QDnsHostAddressRecordPrivate>)QVar9.d.ptr;
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&record);
                      pcStack_910 = pcVar36;
                      local_908 = qVar21;
                      if (status < 0) {
                        pcVar32 = "Invalid canonical name record";
                        goto LAB_0021a24d;
                      }
                      this_02 = &reply_local->canonicalNameRecords;
LAB_0021a17a:
                      iVar33 = status;
                      QList<QDnsDomainNameRecord>::emplaceBack<QDnsDomainNameRecord_const&>
                                (this_02,&record_1);
                      goto LAB_0021a26a;
                    }
                    if (uVar31 == 0xc) {
                      record_1.d.d.ptr =
                           (QSharedDataPointer<QDnsDomainNameRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
                      QDnsDomainNameRecord::QDnsDomainNameRecord(&record_1);
                      pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                          (&record_1.d);
                      QString::operator=(&(pQVar26->super_QDnsRecordPrivate).name,
                                         (QString *)local_898);
                      pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                          (&record_1.d);
                      (pQVar26->super_QDnsRecordPrivate).timeToLive = uVar17;
                      QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                ((QString *)&record,&local_8e8,offset);
                      pQVar26 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                          (&record_1.d);
                      QVar9.d.ptr = (totally_ordered_wrapper<QDnsHostAddressRecordPrivate_*>)
                                    (pQVar26->value).d.d;
                      pcVar36 = (pQVar26->value).d.ptr;
                      (pQVar26->value).d.d = (Data *)record.d.d.ptr;
                      (pQVar26->value).d.ptr = pcStack_910;
                      qVar21 = (pQVar26->value).d.size;
                      (pQVar26->value).d.size = local_908;
                      record.d.d.ptr =
                           (QSharedDataPointer<QDnsHostAddressRecordPrivate>)
                           (QSharedDataPointer<QDnsHostAddressRecordPrivate>)QVar9.d.ptr;
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&record);
                      pcStack_910 = pcVar36;
                      local_908 = qVar21;
                      if (status < 0) {
                        pcVar32 = "Invalid pointer record";
                        goto LAB_0021a24d;
                      }
                      this_02 = &reply_local->pointerRecords;
                      goto LAB_0021a17a;
                    }
                    if (uVar31 == 0xf) {
                      uVar4 = *(ushort *)(response + lVar37 + 10);
                      record_1.d.d.ptr =
                           (QSharedDataPointer<QDnsDomainNameRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
                      QDnsMailExchangeRecord::QDnsMailExchangeRecord
                                ((QDnsMailExchangeRecord *)&record_1);
                      QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                ((QString *)&record,&local_8e8,lVar37 + 0xc);
                      pQVar28 = QSharedDataPointer<QDnsMailExchangeRecordPrivate>::operator->
                                          ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                           &record_1);
                      QVar9.d.ptr = (totally_ordered_wrapper<QDnsHostAddressRecordPrivate_*>)
                                    (pQVar28->exchange).d.d;
                      pcVar36 = (pQVar28->exchange).d.ptr;
                      (pQVar28->exchange).d.d = (Data *)record.d.d.ptr;
                      (pQVar28->exchange).d.ptr = pcStack_910;
                      qVar21 = (pQVar28->exchange).d.size;
                      (pQVar28->exchange).d.size = local_908;
                      record.d.d.ptr =
                           (QSharedDataPointer<QDnsHostAddressRecordPrivate>)
                           (QSharedDataPointer<QDnsHostAddressRecordPrivate>)QVar9.d.ptr;
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&record);
                      pQVar28 = QSharedDataPointer<QDnsMailExchangeRecordPrivate>::operator->
                                          ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                           &record_1);
                      QString::operator=(&(pQVar28->super_QDnsRecordPrivate).name,
                                         (QString *)local_898);
                      pQVar28 = QSharedDataPointer<QDnsMailExchangeRecordPrivate>::operator->
                                          ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                           &record_1);
                      pQVar28->preference = uVar4 << 8 | uVar4 >> 8;
                      pQVar28 = QSharedDataPointer<QDnsMailExchangeRecordPrivate>::operator->
                                          ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                           &record_1);
                      pQVar12 = reply_local;
                      iVar33 = status;
                      (pQVar28->super_QDnsRecordPrivate).timeToLive = uVar17;
                      if (status < 0) {
                        QDnsLookup::tr((QString *)&record,"Invalid mail exchange record",(char *)0x0
                                       ,-1);
                        QDnsLookupReply::makeInvalidReplyError(pQVar12,(QString *)&record);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)&record);
                      }
                      else {
                        QList<QDnsMailExchangeRecord>::emplaceBack<QDnsMailExchangeRecord_const&>
                                  (&reply_local->mailExchangeRecords,
                                   (QDnsMailExchangeRecord *)&record_1);
                      }
                      QDnsMailExchangeRecord::~QDnsMailExchangeRecord
                                ((QDnsMailExchangeRecord *)&record_1);
                      pcStack_910 = pcVar36;
                      local_908 = qVar21;
                      goto LAB_0021a2a3;
                    }
                    if (uVar31 != 0x10) {
                      if (uVar31 == 0x1c) {
                        if (uVar4 == 0x1000) {
                          record.d.d.ptr =
                               (QSharedDataPointer<QDnsHostAddressRecordPrivate>)
                               &DAT_aaaaaaaaaaaaaaaa;
                          QDnsHostAddressRecord::QDnsHostAddressRecord(&record);
                          pQVar25 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                              (&record.d);
                          QString::operator=(&(pQVar25->super_QDnsRecordPrivate).name,
                                             (QString *)local_898);
                          pQVar25 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                              (&record.d);
                          (pQVar25->super_QDnsRecordPrivate).timeToLive = uVar17;
                          QHostAddress::QHostAddress((QHostAddress *)&record_1,response + offset);
LAB_00219f30:
                          pQVar25 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                              (&record.d);
                          QVar38.d.ptr = (totally_ordered_wrapper<QDnsDomainNameRecordPrivate_*>)
                                         (pQVar25->value).d.d.ptr;
                          (pQVar25->value).d.d.ptr = (QHostAddressPrivate *)record_1.d.d.ptr;
                          record_1.d.d.ptr =
                               (QSharedDataPointer<QDnsDomainNameRecordPrivate>)
                               (QSharedDataPointer<QDnsDomainNameRecordPrivate>)QVar38.d.ptr;
                          QHostAddress::~QHostAddress((QHostAddress *)&record_1);
                          QList<QDnsHostAddressRecord>::emplaceBack<QDnsHostAddressRecord_const&>
                                    (&reply_local->hostAddressRecords,&record);
                          QDnsHostAddressRecord::~QDnsHostAddressRecord(&record);
                          goto LAB_0021a2ab;
                        }
                        pcVar32 = "Invalid IPv6 address record";
                      }
                      else if (uVar31 == 0x21) {
                        if (6 < uVar35) {
                          uVar4 = *(ushort *)(response + lVar37 + 10);
                          uVar35 = *(ushort *)(response + lVar37 + 0xc);
                          uVar31 = *(ushort *)(response + lVar37 + 0xe);
                          record_1.d.d.ptr =
                               (QSharedDataPointer<QDnsDomainNameRecordPrivate>)
                               &DAT_aaaaaaaaaaaaaaaa;
                          QDnsServiceRecord::QDnsServiceRecord((QDnsServiceRecord *)&record_1);
                          pQVar27 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                              ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                               &record_1);
                          QString::operator=(&(pQVar27->super_QDnsRecordPrivate).name,
                                             (QString *)local_898);
                          QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                    ((QString *)&record,&local_8e8,lVar37 + 0x10);
                          pQVar27 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                              ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                               &record_1);
                          QVar9.d.ptr = (totally_ordered_wrapper<QDnsHostAddressRecordPrivate_*>)
                                        (pQVar27->target).d.d;
                          pcVar36 = (pQVar27->target).d.ptr;
                          (pQVar27->target).d.d = (Data *)record.d.d.ptr;
                          (pQVar27->target).d.ptr = pcStack_910;
                          qVar21 = (pQVar27->target).d.size;
                          (pQVar27->target).d.size = local_908;
                          record.d.d.ptr =
                               (QSharedDataPointer<QDnsHostAddressRecordPrivate>)
                               (QSharedDataPointer<QDnsHostAddressRecordPrivate>)QVar9.d.ptr;
                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                    ((QArrayDataPointer<char16_t> *)&record);
                          pQVar27 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                              ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                               &record_1);
                          pQVar27->port = uVar31 << 8 | uVar31 >> 8;
                          pQVar27 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                              ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                               &record_1);
                          pQVar27->priority = uVar4 << 8 | uVar4 >> 8;
                          pQVar27 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                              ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                               &record_1);
                          (pQVar27->super_QDnsRecordPrivate).timeToLive = uVar17;
                          pQVar27 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                              ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                               &record_1);
                          pQVar12 = reply_local;
                          iVar33 = status;
                          pQVar27->weight = uVar35 << 8 | uVar35 >> 8;
                          if (status < 0) {
                            QDnsLookup::tr((QString *)&record,"Invalid service record",(char *)0x0,
                                           -1);
                            QDnsLookupReply::makeInvalidReplyError(pQVar12,(QString *)&record);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)&record);
                          }
                          else {
                            QList<QDnsServiceRecord>::emplaceBack<QDnsServiceRecord_const&>
                                      (&reply_local->serviceRecords,(QDnsServiceRecord *)&record_1);
                          }
                          QDnsServiceRecord::~QDnsServiceRecord((QDnsServiceRecord *)&record_1);
                          pcStack_910 = pcVar36;
                          local_908 = qVar21;
                          goto LAB_0021a2a3;
                        }
                        pcVar32 = "Invalid service record";
                      }
                      else {
                        if (uVar31 != 1) goto LAB_0021a2ab;
                        if (uVar4 == 0x400) {
                          uVar20 = *(uint *)(response + offset);
                          record.d.d.ptr =
                               (QSharedDataPointer<QDnsHostAddressRecordPrivate>)
                               &DAT_aaaaaaaaaaaaaaaa;
                          QDnsHostAddressRecord::QDnsHostAddressRecord(&record);
                          pQVar25 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                              (&record.d);
                          QString::operator=(&(pQVar25->super_QDnsRecordPrivate).name,
                                             (QString *)local_898);
                          pQVar25 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                              (&record.d);
                          (pQVar25->super_QDnsRecordPrivate).timeToLive = uVar17;
                          QHostAddress::QHostAddress
                                    ((QHostAddress *)&record_1,
                                     uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                     (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
                          goto LAB_00219f30;
                        }
                        pcVar32 = "Invalid IPv4 address record";
                      }
LAB_0021a320:
                      QDnsLookup::tr((QString *)&record,pcVar32,(char *)0x0,-1);
                      QDnsLookupReply::makeInvalidReplyError(pQVar12,(QString *)&record);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&record);
                      goto LAB_0021a34d;
                    }
                    record_4.d.d.ptr =
                         (QSharedDataPointer<QDnsTextRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
                    QDnsTextRecord::QDnsTextRecord(&record_4);
                    pQVar29 = QSharedDataPointer<QDnsTextRecordPrivate>::operator->(&record_4.d);
                    QString::operator=(&(pQVar29->super_QDnsRecordPrivate).name,(QString *)local_898
                                      );
                    pQVar29 = QSharedDataPointer<QDnsTextRecordPrivate>::operator->(&record_4.d);
                    (pQVar29->super_QDnsRecordPrivate).timeToLive = uVar17;
                    while (pQVar12 = reply_local, offset < lVar1) {
                      QVar38.d.ptr._1_7_ = 0;
                      QVar38.d.ptr._0_1_ = response[offset];
                      lVar30 = (long)QVar38.d.ptr + 1U + offset;
                      if (lVar1 < lVar30) {
                        QDnsLookup::tr((QString *)&record,"Invalid text record",(char *)0x0,-1);
                        QDnsLookupReply::makeInvalidReplyError(pQVar12,(QString *)&record);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)&record);
                        goto LAB_0021a1e2;
                      }
                      pQVar29 = QSharedDataPointer<QDnsTextRecordPrivate>::operator->(&record_4.d);
                      record_1.d.d.ptr =
                           (QSharedDataPointer<QDnsDomainNameRecordPrivate>)
                           (QSharedDataPointer<QDnsDomainNameRecordPrivate>)QVar38.d.ptr;
                      QByteArrayView::toByteArray((QByteArray *)&record,(QByteArrayView *)&record_1)
                      ;
                      QList<QByteArray>::emplaceBack<QByteArray>
                                (&pQVar29->values,(QByteArray *)&record);
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&record);
                      offset = lVar30;
                    }
                    QList<QDnsTextRecord>::emplaceBack<QDnsTextRecord_const&>
                              (&reply_local->textRecords,&record_4);
LAB_0021a1e2:
                    QDnsTextRecord::~QDnsTextRecord(&record_4);
                    if (offset < lVar1) goto LAB_0021a34d;
                  }
LAB_0021a2ab:
                  iVar16 = iVar16 + 1;
                  offset = lVar1;
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_898);
                uVar34 = (ulong)local_8a4;
                lVar30 = offset;
              }
            }
            else {
              local_898._0_8_ = (Data *)0x0;
              local_898._8_8_ = (QDnsCachedName *)0x0;
              local_898._16_8_ = (undefined1 *)0x0;
              QDnsLookupReply::makeInvalidReplyError(reply_local,(QString *)local_898);
LAB_0021a34d:
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_898);
            }
          }
          QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::~QArrayDataPointer
                    ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)&local_8e8);
        }
        else {
          QDnsLookupReply::makeDnsRcodeError
                    (reply_local,
                     ((char *)local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr)[3] &
                     0xf);
        }
      }
    }
    else if (this->protocol == Standard) {
      uVar15 = this->port;
      this_00 = &this->nameserver;
      record_1.d.d.ptr =
           (QSharedDataPointer<QDnsDomainNameRecordPrivate>)
           (QSharedDataPointer<QDnsDomainNameRecordPrivate>)reply_local;
      record.d.d.ptr =
           (QSharedDataPointer<QDnsHostAddressRecordPrivate>)
           (QSharedDataPointer<QDnsHostAddressRecordPrivate>)&qbuffer;
      response = (uchar *)&state;
      bVar14 = QHostAddress::isNull(this_00);
      pcStack_910 = pcVar36;
      if (bVar14) {
LAB_00219790:
        local_8e8.cache.d.d = (Data *)&local_878;
        local_8e8.cache.d.ptr = (QDnsCachedName *)&response;
        local_8e8.cache.d.size = (qsizetype)&record;
        local_8e8.response = (uchar **)&record_1;
        state.options = state.options | 0x20;
        uVar17 = sendStandardDns::anon_class_32_4_ea28d3fd::operator()
                           ((anon_class_32_4_ea28d3fd *)&local_8e8);
        if ((int)uVar17 < 0) {
          uVar34 = 0xffffffffffffffff;
        }
        else {
          uVar20 = (uint)*(undefined8 *)
                          (char *)local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
          if ((uVar20 & 0xf020000) == 0x20000) {
            QVarLengthArray<unsigned_char,_1232LL>::resize(&local_878,0xffff);
            pvVar13 = local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
            *(uint *)((long)record.d.d.ptr + 8) = (uint)*(ushort *)((long)record.d.d.ptr + 8);
            pcStack_910 = (char16_t *)((long)pcVar36 + -0xb);
            *(ulong *)(response + 8) = *(ulong *)(response + 8) | 8;
            uVar17 = sendStandardDns::anon_class_32_4_ea28d3fd::operator()
                               ((anon_class_32_4_ea28d3fd *)&local_8e8);
            QVar11 = record_1;
            if (local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.s < (int)uVar17) {
              this_01 = (anon_class_56_5_c3b57c2e *)local_898;
              QDnsLookup::tr((QString *)this_01,"Reply was too large",(char *)0x0,-1);
              *(undefined4 *)QVar11.d.d.ptr = 1;
              pDVar10 = *(Data **)((long)QVar11.d.d.ptr + 8);
              pQVar8 = *(QDnsCachedName **)((long)QVar11.d.d.ptr + 0x10);
              *(undefined8 *)((long)QVar11.d.d.ptr + 8) = local_898._0_8_;
              *(undefined8 *)((long)QVar11.d.d.ptr + 0x10) = local_898._8_8_;
              qVar21 = *(qsizetype *)((long)QVar11.d.d.ptr + 0x18);
              *(undefined8 *)((long)QVar11.d.d.ptr + 0x18) = local_898._16_8_;
              local_898._0_8_ = pDVar10;
              local_898._8_8_ = pQVar8;
              goto LAB_00219729;
            }
            uVar20 = (uint)*(undefined8 *)(char *)pvVar13;
          }
          uVar34 = (ulong)uVar17;
          *(byte *)((long)record_1.d.d.ptr + 4) = (byte)(uVar20 >> 0x1d) & 1;
        }
      }
      else {
        state.nscount = 1;
        state.nsaddr_list[0].sin_family = 0;
        NVar18 = QHostAddress::protocol(this_00);
        if (NVar18 != IPv6Protocol) {
          state.nsaddr_list[0].sin_zero[4] = '\0';
          state.nsaddr_list[0].sin_zero[5] = '\0';
          state.nsaddr_list[0].sin_zero[6] = '\0';
          state.nsaddr_list[0].sin_zero[7] = '\0';
          state.nsaddr_list[0].sin_addr.s_addr = 0;
          state.nsaddr_list[0].sin_zero[0] = '\0';
          state.nsaddr_list[0].sin_zero[1] = '\0';
          state.nsaddr_list[0].sin_zero[2] = '\0';
          state.nsaddr_list[0].sin_zero[3] = '\0';
          state.nsaddr_list[0].sin_family = 2;
          state.nsaddr_list[0].sin_port = uVar15 << 8 | uVar15 >> 8;
          qVar19 = QHostAddress::toIPv4Address(this_00,(bool *)0x0);
          state.nsaddr_list[0].sin_addr.s_addr =
               qVar19 >> 0x18 | (qVar19 & 0xff0000) >> 8 | (qVar19 & 0xff00) << 8 | qVar19 << 0x18;
LAB_00219774:
          *(ulong *)(char *)local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr =
               *(ulong *)(char *)local_878.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr |
               0x20000000;
          state.options = state.options | 0x4000000;
          goto LAB_00219790;
        }
        bVar14 = setIpv6NameServer<__res_state>(&state,this_00,uVar15);
        if (bVar14) goto LAB_00219774;
        this_01 = &local_8e8;
        QDnsLookup::tr((QString *)this_01,"IPv6 nameservers are currently not supported on this OS",
                       (char *)0x0,-1);
        pQVar12->error = ResolverError;
        pRVar7 = (ReplyBuffer *)(pQVar12->errorString).d.d;
        pQVar8 = (QDnsCachedName *)(pQVar12->errorString).d.ptr;
        (pQVar12->errorString).d.d = (Data *)local_8e8.cache.d.d;
        (pQVar12->errorString).d.ptr = (char16_t *)local_8e8.cache.d.ptr;
        qVar21 = (pQVar12->errorString).d.size;
        (pQVar12->errorString).d.size = local_8e8.cache.d.size;
        local_8e8.cache.d.d = (Data *)pRVar7;
        local_8e8.cache.d.ptr = pQVar8;
LAB_00219729:
        uVar34 = 0xffffffffffffffff;
        (this_01->cache).d.size = qVar21;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
      }
      goto LAB_00219855;
    }
LAB_0021a35c:
    QVarLengthArray<unsigned_char,_1232LL>::~QVarLengthArray(&local_878);
  }
  __res_nclose(&state);
LAB_0021a376:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDnsLookupRunnable::query(QDnsLookupReply *reply)
{
    // Initialize state.
    std::remove_pointer_t<res_state> state = {};
    if (res_ninit(&state) < 0) {
        int error = errno;
        qErrnoWarning(error, "QDnsLookup: Resolver initialization failed");
        return reply->makeResolverSystemError(error);
    }
    auto guard = qScopeGuard([&] { res_nclose(&state); });

#ifdef QDNSLOOKUP_DEBUG
    state.options |= RES_DEBUG;
#endif

    // Prepare the DNS query.
    QueryBuffer qbuffer;
    int queryLength = prepareQueryBuffer(&state, qbuffer, requestName.constData(), ns_rcode(requestType));
    if (Q_UNLIKELY(queryLength < 0))
        return reply->makeResolverSystemError();

    // Perform DNS query.
    QSpan query(qbuffer.data(), queryLength);
    ReplyBuffer buffer(ReplyBufferSize);
    int responseLength = -1;
    switch (protocol) {
    case QDnsLookup::Standard:
        responseLength = sendStandardDns(reply, &state, query, buffer, nameserver, port);
        break;
    case QDnsLookup::DnsOverTls:
        if (!sendDnsOverTls(reply, query, buffer))
            return;
        responseLength = buffer.size();
        break;
    }

    if (responseLength < 0)
        return;

    // Check the reply is valid.
    if (responseLength < int(sizeof(HEADER)))
        return reply->makeInvalidReplyError();

    // Parse the reply.
    auto header = reinterpret_cast<HEADER *>(buffer.data());
    if (header->rcode)
        return reply->makeDnsRcodeError(header->rcode);

    qptrdiff offset = sizeof(HEADER);
    unsigned char *response = buffer.data();
    int status;

    auto expandHost = [&, cache = Cache{}](qptrdiff offset) mutable {
        if (uchar n = response[offset]; n & NS_CMPRSFLGS) {
            // compressed name, see if we already have it cached
            if (offset + 1 < responseLength) {
                int id = ((n & ~NS_CMPRSFLGS) << 8) | response[offset + 1];
                auto it = std::find_if(cache.constBegin(), cache.constEnd(),
                                  [id](const QDnsCachedName &n) { return n.code == id; });
                if (it != cache.constEnd()) {
                    status = 2;
                    return it->name;
                }
            }
        }

        // uncached, expand it
        char host[MAXCDNAME + 1];
        status = dn_expand(response, response + responseLength, response + offset,
                           host, sizeof(host));
        if (status >= 0)
            return cache.emplaceBack(decodeLabel(QLatin1StringView(host)), offset).name;

        // failed
        reply->makeInvalidReplyError(QDnsLookup::tr("Could not expand domain name"));
        return QString();
    };

    if (ntohs(header->qdcount) == 1) {
        // Skip the query host, type (2 bytes) and class (2 bytes).
        expandHost(offset);
        if (status < 0)
            return;
        if (offset + status + 4 > responseLength)
            header->qdcount = 0xffff;   // invalid reply below
        else
            offset += status + 4;
    }
    if (ntohs(header->qdcount) > 1)
        return reply->makeInvalidReplyError();

    // Extract results.
    const int answerCount = ntohs(header->ancount);
    int answerIndex = 0;
    while ((offset < responseLength) && (answerIndex < answerCount)) {
        const QString name = expandHost(offset);
        if (status < 0)
            return;

        offset += status;
        if (offset + RRFIXEDSZ > responseLength) {
            // probably just a truncated reply, return what we have
            return;
        }
        const quint16 type = qFromBigEndian<quint16>(response + offset);
        const qint16 rrclass = qFromBigEndian<quint16>(response + offset + 2);
        const quint32 ttl = qFromBigEndian<quint32>(response + offset + 4);
        const quint16 size = qFromBigEndian<quint16>(response + offset + 8);
        offset += RRFIXEDSZ;
        if (offset + size > responseLength)
            return;             // truncated
        if (rrclass != C_IN)
            continue;

        if (type == QDnsLookup::A) {
            if (size != 4)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid IPv4 address record"));
            const quint32 addr = qFromBigEndian<quint32>(response + offset);
            QDnsHostAddressRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = QHostAddress(addr);
            reply->hostAddressRecords.append(record);
        } else if (type == QDnsLookup::AAAA) {
            if (size != 16)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid IPv6 address record"));
            QDnsHostAddressRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = QHostAddress(response + offset);
            reply->hostAddressRecords.append(record);
        } else if (type == QDnsLookup::CNAME) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid canonical name record"));
            reply->canonicalNameRecords.append(record);
        } else if (type == QDnsLookup::NS) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid name server record"));
            reply->nameServerRecords.append(record);
        } else if (type == QDnsLookup::PTR) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid pointer record"));
            reply->pointerRecords.append(record);
        } else if (type == QDnsLookup::MX) {
            const quint16 preference = qFromBigEndian<quint16>(response + offset);
            QDnsMailExchangeRecord record;
            record.d->exchange = expandHost(offset + 2);
            record.d->name = name;
            record.d->preference = preference;
            record.d->timeToLive = ttl;
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid mail exchange record"));
            reply->mailExchangeRecords.append(record);
        } else if (type == QDnsLookup::SRV) {
            if (size < 7)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid service record"));
            const quint16 priority = qFromBigEndian<quint16>(response + offset);
            const quint16 weight = qFromBigEndian<quint16>(response + offset + 2);
            const quint16 port = qFromBigEndian<quint16>(response + offset + 4);
            QDnsServiceRecord record;
            record.d->name = name;
            record.d->target = expandHost(offset + 6);
            record.d->port = port;
            record.d->priority = priority;
            record.d->timeToLive = ttl;
            record.d->weight = weight;
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid service record"));
            reply->serviceRecords.append(record);
        } else if (type == QDnsLookup::TLSA) {
            // https://datatracker.ietf.org/doc/html/rfc6698#section-2.1
            if (size < 3)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid TLS association record"));

            const quint8 usage = response[offset];
            const quint8 selector = response[offset + 1];
            const quint8 matchType = response[offset + 2];

            QDnsTlsAssociationRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->usage = QDnsTlsAssociationRecord::CertificateUsage(usage);
            record.d->selector = QDnsTlsAssociationRecord::Selector(selector);
            record.d->matchType = QDnsTlsAssociationRecord::MatchingType(matchType);
            record.d->value.assign(response + offset + 3, response + offset + size);
            reply->tlsAssociationRecords.append(std::move(record));
        } else if (type == QDnsLookup::TXT) {
            QDnsTextRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            qptrdiff txt = offset;
            while (txt < offset + size) {
                const unsigned char length = response[txt];
                txt++;
                if (txt + length > offset + size)
                    return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid text record"));
                record.d->values << QByteArrayView(response + txt, length).toByteArray();
                txt += length;
            }
            reply->textRecords.append(record);
        }
        offset += size;
        answerIndex++;
    }
}